

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  long lVar2;
  Version *pVVar3;
  Version *pVVar4;
  pointer ppFVar5;
  FileMetaData *this_00;
  uint __line;
  ulong uVar6;
  char *__assertion;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->refs_ != 0) {
    __assertion = "refs_ == 0";
    __line = 0x45;
LAB_0053b1bf:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,__line,"leveldb::Version::~Version()");
  }
  pVVar3 = this->next_;
  pVVar4 = this->prev_;
  pVVar4->next_ = pVVar3;
  pVVar3->prev_ = pVVar4;
  lVar7 = 0;
  do {
    if (lVar7 == 7) {
      lVar7 = 0xb0;
      do {
        std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
        ~_Vector_base((_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       *)((long)this->files_ + lVar7 + -0x20));
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    for (uVar6 = 0;
        ppFVar5 = this->files_[lVar7].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)this->files_[lVar7].
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3);
        uVar6 = uVar6 + 1) {
      this_00 = ppFVar5[uVar6];
      iVar1 = this_00->refs;
      if (iVar1 < 1) {
        __assertion = "f->refs > 0";
        __line = 0x4f;
        goto LAB_0053b1bf;
      }
      this_00->refs = iVar1 + -1;
      if (iVar1 == 1) {
        FileMetaData::~FileMetaData(this_00);
        operator_delete(this_00,0x58);
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}